

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuzzingParameterSet.cpp
# Opt level: O1

void __thiscall
FuzzingParameterSet::FuzzingParameterSet(FuzzingParameterSet *this,int measured_num_acts_per_ref)

{
  uint uVar1;
  size_t __i;
  long lVar2;
  size_t __i_1;
  ulong uVar3;
  ulong local_2728 [624];
  undefined8 local_13a8;
  undefined1 local_13a0 [8];
  random_device rd;
  
  (this->gen)._M_x[0] = 0x1571;
  lVar2 = 1;
  uVar3 = 0x1571;
  do {
    uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar2);
    (this->gen)._M_x[lVar2] = uVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x270);
  (this->gen)._M_p = 0x270;
  this->num_activations_per_tREFI = -1;
  (this->start_row).min = 0;
  (this->start_row).max = 0;
  (this->start_row).step = 1;
  (this->start_row).dist._M_param._M_a = 0;
  *(undefined8 *)&(this->start_row).dist._M_param._M_b = 0x7fffffff;
  (this->num_aggressors_for_sync).max = 0;
  (this->num_aggressors_for_sync).step = 1;
  (this->num_aggressors_for_sync).dist._M_param = (param_type)0x7fffffff00000000;
  (this->bank_no).min = 0;
  (this->bank_no).max = 0;
  (this->bank_no).step = 1;
  (this->bank_no).dist._M_param._M_a = 0;
  *(undefined8 *)&(this->bank_no).dist._M_param._M_b = 0x7fffffff;
  (this->use_sequential_aggressors).max = 0;
  (this->use_sequential_aggressors).step = 1;
  (this->use_sequential_aggressors).dist._M_param = (param_type)0x7fffffff00000000;
  (this->amplitude).min = 0;
  (this->amplitude).max = 0;
  (this->amplitude).step = 1;
  (this->amplitude).dist._M_param._M_a = 0;
  *(undefined8 *)&(this->amplitude).dist._M_param._M_b = 0x7fffffff;
  (this->N_sided).max = 0;
  (this->N_sided).step = 1;
  (this->N_sided).dist._M_param = (param_type)0x7fffffff00000000;
  (this->sync_each_ref).min = 0;
  (this->sync_each_ref).max = 0;
  (this->sync_each_ref).step = 1;
  (this->sync_each_ref).dist._M_param._M_a = 0;
  *(undefined8 *)&(this->sync_each_ref).dist._M_param._M_b = 0x7fffffff;
  (this->wait_until_start_hammering_refs).max = 0;
  (this->wait_until_start_hammering_refs).step = 1;
  (this->wait_until_start_hammering_refs).dist._M_param = (param_type)0x7fffffff00000000;
  (this->N_sided_probabilities)._M_param._M_prob.super__Vector_base<double,_std::allocator<double>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->N_sided_probabilities)._M_param._M_prob.super__Vector_base<double,_std::allocator<double>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->N_sided_probabilities)._M_param._M_prob.super__Vector_base<double,_std::allocator<double>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->N_sided_probabilities)._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->N_sided_probabilities)._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->N_sided_probabilities)._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->flushing_strategy = EARLIEST_POSSIBLE;
  this->fencing_strategy = LATEST_POSSIBLE;
  std::random_device::random_device((random_device *)local_13a0);
  uVar1 = std::random_device::_M_getval();
  local_2728[0] = (ulong)uVar1;
  lVar2 = 1;
  uVar3 = local_2728[0];
  do {
    uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar2);
    local_2728[lVar2] = uVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x270);
  local_13a8 = 0x270;
  memcpy(this,local_2728,5000);
  this->num_activations_per_tREFI =
       measured_num_acts_per_ref - (measured_num_acts_per_ref >> 0x1f) & 0xfffffffe;
  randomize_parameters(this,false);
  std::random_device::_M_fini();
  return;
}

Assistant:

FuzzingParameterSet::FuzzingParameterSet(int measured_num_acts_per_ref) : /* NOLINT */
    flushing_strategy(FLUSHING_STRATEGY::EARLIEST_POSSIBLE),
    fencing_strategy(FENCING_STRATEGY::LATEST_POSSIBLE) {
  std::random_device rd;
  gen = std::mt19937(rd());  // standard mersenne_twister_engine seeded with some random data

  set_num_activations_per_t_refi(measured_num_acts_per_ref);

  // call randomize_parameters once to initialize static values
  randomize_parameters(false);
}